

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

void __thiscall
Js::AsmJsVarBase::AsmJsVarBase(AsmJsVarBase *this,PropertyName name,SymbolType type,bool isMutable)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool isMutable_local;
  SymbolType type_local;
  PropertyName name_local;
  AsmJsVarBase *this_local;
  
  AsmJsSymbol::AsmJsSymbol(&this->super_AsmJsSymbol,name,type);
  (this->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_01df2ef8;
  AsmJsVarType::AsmJsVarType((AsmJsVarType *)&(this->super_AsmJsSymbol).field_0x14,Double);
  this->mLocation = 0xffffffff;
  this->mIsMutable = isMutable;
  bVar2 = Is(&this->super_AsmJsSymbol);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1af,"(AsmJsVarBase::Is(this))","AsmJsVarBase::Is(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

AsmJsVarBase::AsmJsVarBase(PropertyName name, AsmJsSymbol::SymbolType type, bool isMutable /*= true*/) :
        AsmJsSymbol(name, type)
        , mType(AsmJsVarType::Double)
        , mLocation(Js::Constants::NoRegister)
        , mIsMutable(isMutable)
    {
        Assert(AsmJsVarBase::Is(this));
    }